

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O1

_Bool Hacl_Impl_P256_DH_ecp256dh_r
                (uint8_t *shared_secret,uint8_t *their_pubkey,uint8_t *private_key)

{
  _Bool _Var1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  sbyte sVar7;
  long lVar8;
  uint64_t *t11_1;
  ulong uVar9;
  uint uVar10;
  uint64_t *t11_2;
  ulong uVar11;
  ulong uVar12;
  uint64_t *puVar13;
  uint64_t *puVar14;
  uint64_t *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint64_t *t11_3;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint64_t *t11;
  ulong uVar22;
  ulong uVar23;
  uint64_t t1;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  byte bVar28;
  uint64_t table [192];
  uint64_t ss_proj [12];
  uint64_t tmp [16];
  uint64_t tmp_1 [12];
  uint64_t local_818;
  ulong uStack_810;
  ulong local_808;
  ulong uStack_800;
  ulong local_7f8;
  ulong uStack_7f0;
  ulong local_7e8;
  ulong uStack_7e0;
  ulong local_7d8;
  ulong uStack_7d0;
  ulong local_7c8;
  ulong uStack_7c0;
  ulong local_7b8;
  ulong local_7b0;
  ulong local_7a8;
  ulong local_7a0;
  ulong local_798;
  uint local_78c;
  ulong local_788;
  uint8_t *local_780;
  uint64_t local_778 [12];
  ulong local_718;
  ulong local_710;
  ulong local_708;
  ulong local_700;
  ulong local_6f8;
  ulong local_6f0;
  ulong local_6e8;
  ulong local_6e0;
  ulong local_6d8;
  ulong local_6d0;
  ulong local_6c8;
  ulong local_6c0;
  ulong local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  ulong local_6a0;
  ulong local_698;
  ulong local_690;
  ulong local_688;
  ulong local_680;
  ulong local_678;
  ulong local_670;
  ulong local_668;
  ulong local_660;
  ulong local_658;
  ulong local_650;
  ulong local_648;
  ulong local_640;
  ulong local_638;
  ulong local_630;
  ulong local_628;
  ulong local_620;
  ulong local_618;
  ulong local_610;
  ulong local_608;
  ulong local_600;
  ulong local_5f8;
  ulong local_5f0;
  ulong local_5e8;
  ulong local_5e0;
  ulong local_5d8;
  ulong local_5d0;
  ulong local_5c8;
  ulong local_5c0;
  ulong local_5b8;
  ulong local_5b0;
  ulong local_5a8;
  ulong local_5a0;
  ulong local_598;
  ulong local_590;
  ulong local_588;
  ulong local_580;
  ulong local_578;
  ulong local_570;
  ulong local_568;
  ulong local_560;
  ulong local_558;
  ulong local_550;
  ulong local_548;
  ulong local_540;
  ulong local_538;
  ulong local_530;
  ulong local_528;
  ulong local_520;
  ulong local_518;
  ulong local_510;
  ulong local_508;
  ulong local_500;
  ulong local_4f8;
  ulong local_4f0;
  ulong local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  ulong local_4d0;
  ulong local_4c8;
  ulong local_4c0;
  ulong local_4b8;
  ulong local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  ulong local_498;
  ulong local_490;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  ulong local_460;
  ulong local_458;
  ulong local_450;
  ulong local_448;
  ulong local_440;
  ulong local_438;
  ulong local_430;
  ulong local_428;
  ulong local_420;
  ulong local_418;
  ulong local_410;
  ulong local_408;
  ulong local_400;
  ulong local_3f8;
  ulong local_3f0;
  ulong local_3e8;
  ulong local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  ulong local_3a0;
  ulong local_398;
  ulong local_390;
  ulong local_388;
  ulong local_380;
  ulong local_378;
  ulong local_370;
  ulong local_368;
  ulong local_360;
  ulong local_358;
  ulong local_350;
  ulong local_348;
  ulong local_340;
  ulong local_338;
  ulong local_330;
  ulong local_328;
  ulong local_320;
  ulong local_318;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  ulong local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  ulong local_280;
  ulong local_278;
  ulong local_270;
  ulong local_268;
  ulong local_260;
  ulong local_258;
  ulong local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  uint64_t local_178 [12];
  ulong local_118 [4];
  uint64_t local_f8 [25];
  
  bVar28 = 0;
  local_f8[10] = 0;
  local_f8[0xb] = 0;
  local_f8[8] = 0;
  local_f8[9] = 0;
  local_f8[6] = 0;
  local_f8[7] = 0;
  local_f8[4] = 0;
  local_f8[5] = 0;
  local_f8[2] = 0;
  local_f8[3] = 0;
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_780 = shared_secret;
  _Var1 = load_point_vartime(local_f8,their_pubkey);
  uVar11 = *(ulong *)(private_key + 0x18);
  uVar24 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18
           | (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18
           | (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
  uVar11 = *(ulong *)(private_key + 0x10);
  uVar16 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18
           | (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18
           | (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
  uVar11 = *(ulong *)(private_key + 8);
  uVar19 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18
           | (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18
           | (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
  uVar11 = *(ulong *)private_key;
  uVar11 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18
           | (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18
           | (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
  local_118[0] = uVar24;
  local_118[1] = uVar16;
  local_118[2] = uVar19;
  local_118[3] = uVar11;
  uVar3 = FStar_UInt64_eq_mask(uVar24,0);
  uVar4 = FStar_UInt64_eq_mask(uVar16,0);
  uVar5 = FStar_UInt64_eq_mask(uVar19,0);
  uVar6 = FStar_UInt64_eq_mask(uVar11,0);
  local_788 = ~(uVar6 & uVar5 & uVar4 & uVar3) &
              -(ulong)(uVar11 < 0xffffffff00000000 ||
                      uVar11 + 0x100000000 <
                      (ulong)(uVar19 != 0xffffffffffffffff ||
                             uVar19 + 1 <
                             (ulong)(uVar16 < 0xbce6faada7179e84 ||
                                    uVar16 + 0x4319055258e8617c <
                                    (ulong)(uVar24 < 0xf3b9cac2fc632551))));
  local_118[0] = (uVar24 ^ 1) & local_788 ^ 1;
  local_118[1] = uVar16 & local_788;
  local_118[2] = uVar19 & local_788;
  local_118[3] = uVar11 & local_788;
  local_178[10] = 0;
  local_178[0xb] = 0;
  local_178[8] = 0;
  local_178[9] = 0;
  local_178[6] = 0;
  local_178[7] = 0;
  local_178[4] = 0;
  local_178[5] = 0;
  local_178[2] = 0;
  local_178[3] = 0;
  local_178[0] = 0;
  local_178[1] = 0;
  if (_Var1) {
    memset(local_778,0,0x600);
    puVar14 = local_f8 + 0xc;
    local_f8[0x16] = 0;
    local_f8[0x17] = 0;
    local_f8[0x14] = 0;
    local_f8[0x15] = 0;
    local_f8[0x12] = 0;
    local_f8[0x13] = 0;
    local_f8[0x10] = 0;
    local_f8[0x11] = 0;
    local_f8[0xe] = 0;
    local_f8[0xf] = 0;
    local_f8[0xc] = 0;
    local_f8[0xd] = 0;
    local_778[0] = 0;
    local_778[1] = 0;
    local_778[2] = 0;
    local_778[3] = 0;
    local_778[4] = 1;
    local_778[5] = 0xffffffff00000000;
    local_778[6] = 0xffffffffffffffff;
    local_778[7] = 0xfffffffe;
    local_778[8] = 0;
    local_778[9] = 0;
    local_778[10] = 0;
    local_778[0xb] = 0;
    puVar13 = local_f8;
    puVar15 = &local_718;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_double(puVar14,&local_718);
    puVar13 = puVar14;
    puVar15 = &local_6b8;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_add(puVar14,local_f8,&local_6b8);
    puVar13 = puVar14;
    puVar15 = &local_658;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_double(puVar14,&local_6b8);
    puVar13 = puVar14;
    puVar15 = &local_5f8;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_add(puVar14,local_f8,&local_5f8);
    puVar13 = puVar14;
    puVar15 = &local_598;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_double(puVar14,&local_658);
    puVar13 = puVar14;
    puVar15 = &local_538;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_add(puVar14,local_f8,&local_538);
    puVar13 = puVar14;
    puVar15 = &local_4d8;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_double(puVar14,&local_5f8);
    puVar13 = puVar14;
    puVar15 = &local_478;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_add(puVar14,local_f8,&local_478);
    puVar13 = puVar14;
    puVar15 = &local_418;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_double(puVar14,&local_598);
    puVar13 = puVar14;
    puVar15 = &local_3b8;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_add(puVar14,local_f8,&local_3b8);
    puVar13 = puVar14;
    puVar15 = &local_358;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_double(puVar14,&local_538);
    puVar13 = puVar14;
    puVar15 = &local_2f8;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_add(puVar14,local_f8,&local_2f8);
    puVar13 = puVar14;
    puVar15 = &local_298;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_double(puVar14,&local_4d8);
    puVar13 = puVar14;
    puVar15 = &local_238;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar15 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
    }
    point_add(puVar14,local_f8,&local_238);
    puVar13 = &local_1d8;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar13 = *puVar14;
      puVar14 = puVar14 + (ulong)bVar28 * -2 + 1;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
    }
    local_178[2] = 0;
    local_178[3] = 0;
    local_178[0] = 0;
    local_178[1] = 0;
    local_178[4] = 1;
    local_178[5] = 0xffffffff00000000;
    local_178[6] = 0xffffffffffffffff;
    local_178[7] = 0xfffffffe;
    local_178[8] = 0;
    local_178[9] = 0;
    local_178[10] = 0;
    local_178[0xb] = 0;
    local_7c8 = 0;
    uStack_7c0 = 0;
    local_7d8 = 0;
    uStack_7d0 = 0;
    local_7e8 = 0;
    uStack_7e0 = 0;
    local_7f8 = 0;
    uStack_7f0 = 0;
    local_808 = 0;
    uStack_800 = 0;
    local_818 = 0;
    uStack_810 = 0;
    uVar10 = 0xfc;
    do {
      point_double(local_178,local_178);
      point_double(local_178,local_178);
      point_double(local_178,local_178);
      point_double(local_178,local_178);
      uVar2 = uVar10 >> 6;
      sVar7 = (sbyte)(uVar10 & 0x3c);
      uVar21 = (uint)(local_118[uVar2] >> sVar7);
      if ((uVar10 & 0x3c) != 0 && uVar2 != 3) {
        uVar21 = uVar21 | (uint)(local_118[(ulong)uVar2 + 1] << (-sVar7 & 0x3fU));
      }
      uVar11 = (ulong)(uVar21 & 0xf);
      puVar14 = local_778;
      puVar13 = &local_818;
      local_78c = uVar10;
      for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar13 = *puVar14;
        puVar14 = puVar14 + (ulong)bVar28 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      }
      local_7b8 = uVar11;
      uVar3 = FStar_UInt64_eq_mask(uVar11,1);
      uVar9 = ~uVar3;
      uVar16 = local_818 & uVar9 | local_718 & uVar3;
      uVar17 = uStack_810 & uVar9 | local_710 & uVar3;
      uVar25 = local_808 & uVar9 | local_708 & uVar3;
      uVar20 = uStack_800 & uVar9 | local_700 & uVar3;
      uVar12 = local_7f8 & uVar9 | local_6f8 & uVar3;
      uVar19 = uStack_7f0 & uVar9 | local_6f0 & uVar3;
      uVar24 = local_7e8 & uVar9 | local_6e8 & uVar3;
      uStack_7e0 = uStack_7e0 & uVar9 | local_6e0 & uVar3;
      local_7d8 = local_7d8 & uVar9 | local_6d8 & uVar3;
      uStack_7d0 = uStack_7d0 & uVar9 | local_6d0 & uVar3;
      local_7c8 = local_7c8 & uVar9 | local_6c8 & uVar3;
      uVar9 = uVar9 & uStack_7c0 | uVar3 & local_6c0;
      local_818 = uVar16;
      uStack_810 = uVar17;
      local_808 = uVar25;
      uStack_800 = uVar20;
      local_7f8 = uVar12;
      uStack_7f0 = uVar19;
      local_7e8 = uVar24;
      uStack_7c0 = uVar9;
      local_7b0 = local_7c8;
      local_7a8 = uStack_7d0;
      local_7a0 = local_7d8;
      local_798 = uStack_7e0;
      uVar3 = FStar_UInt64_eq_mask(uVar11,2);
      uVar22 = ~uVar3;
      uVar11 = uVar16 & uVar22 | local_6b8 & uVar3;
      uVar18 = uVar17 & uVar22 | local_6b0 & uVar3;
      uVar26 = uVar25 & uVar22 | local_6a8 & uVar3;
      uVar25 = uVar20 & uVar22 | local_6a0 & uVar3;
      uVar12 = uVar12 & uVar22 | local_698 & uVar3;
      uVar17 = uVar19 & uVar22 | local_690 & uVar3;
      uVar16 = uVar24 & uVar22 | local_688 & uVar3;
      uStack_7e0 = local_798 & uVar22 | local_680 & uVar3;
      local_7d8 = local_7a0 & uVar22 | local_678 & uVar3;
      uStack_7d0 = local_7a8 & uVar22 | local_670 & uVar3;
      local_7c8 = local_7b0 & uVar22 | local_668 & uVar3;
      uVar23 = uVar22 & uVar9 | uVar3 & local_660;
      local_818 = uVar11;
      uStack_810 = uVar18;
      local_808 = uVar26;
      uStack_800 = uVar25;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7c0 = uVar23;
      local_7b0 = local_7c8;
      local_7a8 = uStack_7d0;
      local_7a0 = local_7d8;
      local_798 = uStack_7e0;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,3);
      uVar20 = ~uVar3;
      uVar11 = uVar11 & uVar20 | local_658 & uVar3;
      uVar19 = uVar18 & uVar20 | local_650 & uVar3;
      uVar24 = uVar26 & uVar20 | local_648 & uVar3;
      uVar9 = uVar25 & uVar20 | local_640 & uVar3;
      uVar12 = uVar12 & uVar20 | local_638 & uVar3;
      uVar17 = uVar17 & uVar20 | local_630 & uVar3;
      uVar16 = uVar16 & uVar20 | local_628 & uVar3;
      uVar22 = local_798 & uVar20 | local_620 & uVar3;
      uVar18 = local_7a0 & uVar20 | local_618 & uVar3;
      uVar25 = local_7a8 & uVar20 | local_610 & uVar3;
      uVar26 = local_7b0 & uVar20 | local_608 & uVar3;
      uVar20 = uVar20 & uVar23 | uVar3 & local_600;
      local_818 = uVar11;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar22;
      local_7d8 = uVar18;
      uStack_7d0 = uVar25;
      local_7c8 = uVar26;
      uStack_7c0 = uVar20;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,4);
      uVar23 = ~uVar3;
      uVar11 = uVar11 & uVar23 | local_5f8 & uVar3;
      uVar19 = uVar19 & uVar23 | local_5f0 & uVar3;
      uVar24 = uVar24 & uVar23 | local_5e8 & uVar3;
      uVar9 = uVar9 & uVar23 | local_5e0 & uVar3;
      uVar12 = uVar12 & uVar23 | local_5d8 & uVar3;
      uVar17 = uVar17 & uVar23 | local_5d0 & uVar3;
      uVar16 = uVar16 & uVar23 | local_5c8 & uVar3;
      uVar27 = uVar22 & uVar23 | local_5c0 & uVar3;
      uVar22 = uVar18 & uVar23 | local_5b8 & uVar3;
      uVar18 = uVar25 & uVar23 | local_5b0 & uVar3;
      uVar26 = uVar26 & uVar23 | local_5a8 & uVar3;
      uVar23 = uVar23 & uVar20 | uVar3 & local_5a0;
      local_818 = uVar11;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar27;
      local_7d8 = uVar22;
      uStack_7d0 = uVar18;
      local_7c8 = uVar26;
      uStack_7c0 = uVar23;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,5);
      uVar20 = ~uVar3;
      uVar11 = uVar11 & uVar20 | local_598 & uVar3;
      uVar19 = uVar19 & uVar20 | local_590 & uVar3;
      uVar24 = uVar24 & uVar20 | local_588 & uVar3;
      uVar9 = uVar9 & uVar20 | local_580 & uVar3;
      uVar12 = uVar12 & uVar20 | local_578 & uVar3;
      uVar17 = uVar17 & uVar20 | local_570 & uVar3;
      uVar16 = uVar16 & uVar20 | local_568 & uVar3;
      uVar27 = uVar27 & uVar20 | local_560 & uVar3;
      uVar25 = uVar22 & uVar20 | local_558 & uVar3;
      uVar18 = uVar18 & uVar20 | local_550 & uVar3;
      uVar22 = uVar26 & uVar20 | local_548 & uVar3;
      uVar20 = uVar20 & uVar23 | uVar3 & local_540;
      local_818 = uVar11;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar27;
      local_7d8 = uVar25;
      uStack_7d0 = uVar18;
      local_7c8 = uVar22;
      uStack_7c0 = uVar20;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,6);
      uVar26 = ~uVar3;
      uVar11 = uVar11 & uVar26 | local_538 & uVar3;
      uVar19 = uVar19 & uVar26 | local_530 & uVar3;
      uVar24 = uVar24 & uVar26 | local_528 & uVar3;
      uVar9 = uVar9 & uVar26 | local_520 & uVar3;
      uVar12 = uVar12 & uVar26 | local_518 & uVar3;
      uVar17 = uVar17 & uVar26 | local_510 & uVar3;
      uVar16 = uVar16 & uVar26 | local_508 & uVar3;
      uVar23 = uVar27 & uVar26 | local_500 & uVar3;
      uVar25 = uVar25 & uVar26 | local_4f8 & uVar3;
      uVar18 = uVar18 & uVar26 | local_4f0 & uVar3;
      uVar22 = uVar22 & uVar26 | local_4e8 & uVar3;
      uVar26 = uVar26 & uVar20 | uVar3 & local_4e0;
      local_818 = uVar11;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar23;
      local_7d8 = uVar25;
      uStack_7d0 = uVar18;
      local_7c8 = uVar22;
      uStack_7c0 = uVar26;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,7);
      uVar20 = ~uVar3;
      uVar11 = uVar11 & uVar20 | local_4d8 & uVar3;
      uVar19 = uVar19 & uVar20 | local_4d0 & uVar3;
      uVar24 = uVar24 & uVar20 | local_4c8 & uVar3;
      uVar9 = uVar9 & uVar20 | local_4c0 & uVar3;
      uVar12 = uVar12 & uVar20 | local_4b8 & uVar3;
      uVar17 = uVar17 & uVar20 | local_4b0 & uVar3;
      uVar16 = uVar16 & uVar20 | local_4a8 & uVar3;
      uVar23 = uVar23 & uVar20 | local_4a0 & uVar3;
      uVar25 = uVar25 & uVar20 | local_498 & uVar3;
      uVar18 = uVar18 & uVar20 | local_490 & uVar3;
      uVar22 = uVar22 & uVar20 | local_488 & uVar3;
      uVar20 = uVar20 & uVar26 | uVar3 & local_480;
      local_818 = uVar11;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar23;
      local_7d8 = uVar25;
      uStack_7d0 = uVar18;
      local_7c8 = uVar22;
      uStack_7c0 = uVar20;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,8);
      uVar26 = ~uVar3;
      uVar11 = uVar11 & uVar26 | local_478 & uVar3;
      uVar19 = uVar19 & uVar26 | local_470 & uVar3;
      uVar24 = uVar24 & uVar26 | local_468 & uVar3;
      uVar9 = uVar9 & uVar26 | local_460 & uVar3;
      uVar12 = uVar12 & uVar26 | local_458 & uVar3;
      uVar17 = uVar17 & uVar26 | local_450 & uVar3;
      uVar16 = uVar16 & uVar26 | local_448 & uVar3;
      uVar23 = uVar23 & uVar26 | local_440 & uVar3;
      uVar25 = uVar25 & uVar26 | local_438 & uVar3;
      uVar18 = uVar18 & uVar26 | local_430 & uVar3;
      uVar22 = uVar22 & uVar26 | local_428 & uVar3;
      uVar26 = uVar26 & uVar20 | uVar3 & local_420;
      local_818 = uVar11;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar23;
      local_7d8 = uVar25;
      uStack_7d0 = uVar18;
      local_7c8 = uVar22;
      uStack_7c0 = uVar26;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,9);
      uVar20 = ~uVar3;
      uVar11 = uVar11 & uVar20 | local_418 & uVar3;
      uVar19 = uVar19 & uVar20 | local_410 & uVar3;
      uVar24 = uVar24 & uVar20 | local_408 & uVar3;
      uVar9 = uVar9 & uVar20 | local_400 & uVar3;
      uVar12 = uVar12 & uVar20 | local_3f8 & uVar3;
      uVar17 = uVar17 & uVar20 | local_3f0 & uVar3;
      uVar16 = uVar16 & uVar20 | local_3e8 & uVar3;
      uVar23 = uVar23 & uVar20 | local_3e0 & uVar3;
      uVar25 = uVar25 & uVar20 | local_3d8 & uVar3;
      uVar18 = uVar18 & uVar20 | local_3d0 & uVar3;
      uVar22 = uVar22 & uVar20 | local_3c8 & uVar3;
      uVar20 = uVar20 & uVar26 | uVar3 & local_3c0;
      local_818 = uVar11;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar23;
      local_7d8 = uVar25;
      uStack_7d0 = uVar18;
      local_7c8 = uVar22;
      uStack_7c0 = uVar20;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,10);
      uVar26 = ~uVar3;
      uVar11 = uVar11 & uVar26 | local_3b8 & uVar3;
      uVar19 = uVar19 & uVar26 | local_3b0 & uVar3;
      uVar24 = uVar24 & uVar26 | local_3a8 & uVar3;
      uVar9 = uVar9 & uVar26 | local_3a0 & uVar3;
      uVar12 = uVar12 & uVar26 | local_398 & uVar3;
      uVar17 = uVar17 & uVar26 | local_390 & uVar3;
      uVar16 = uVar16 & uVar26 | local_388 & uVar3;
      uVar23 = uVar23 & uVar26 | local_380 & uVar3;
      uVar25 = uVar25 & uVar26 | local_378 & uVar3;
      uVar18 = uVar18 & uVar26 | local_370 & uVar3;
      uVar22 = uVar22 & uVar26 | local_368 & uVar3;
      uVar26 = uVar26 & uVar20 | uVar3 & local_360;
      local_818 = uVar11;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar23;
      local_7d8 = uVar25;
      uStack_7d0 = uVar18;
      local_7c8 = uVar22;
      uStack_7c0 = uVar26;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,0xb);
      uVar20 = ~uVar3;
      uVar11 = uVar11 & uVar20 | local_358 & uVar3;
      uVar19 = uVar19 & uVar20 | local_350 & uVar3;
      uVar24 = uVar24 & uVar20 | local_348 & uVar3;
      uVar9 = uVar9 & uVar20 | local_340 & uVar3;
      uVar12 = uVar12 & uVar20 | local_338 & uVar3;
      uVar17 = uVar17 & uVar20 | local_330 & uVar3;
      uVar16 = uVar16 & uVar20 | local_328 & uVar3;
      uVar27 = uVar23 & uVar20 | local_320 & uVar3;
      uVar25 = uVar25 & uVar20 | local_318 & uVar3;
      uVar18 = uVar18 & uVar20 | local_310 & uVar3;
      uVar22 = uVar22 & uVar20 | local_308 & uVar3;
      uVar20 = uVar20 & uVar26 | uVar3 & local_300;
      local_818 = uVar11;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar27;
      local_7d8 = uVar25;
      uStack_7d0 = uVar18;
      local_7c8 = uVar22;
      uStack_7c0 = uVar20;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,0xc);
      uVar23 = ~uVar3;
      uVar11 = uVar11 & uVar23 | local_2f8 & uVar3;
      uVar19 = uVar19 & uVar23 | local_2f0 & uVar3;
      uVar24 = uVar24 & uVar23 | local_2e8 & uVar3;
      uVar9 = uVar9 & uVar23 | local_2e0 & uVar3;
      uVar12 = uVar12 & uVar23 | local_2d8 & uVar3;
      uVar17 = uVar17 & uVar23 | local_2d0 & uVar3;
      uVar16 = uVar16 & uVar23 | local_2c8 & uVar3;
      uVar27 = uVar27 & uVar23 | local_2c0 & uVar3;
      uVar25 = uVar25 & uVar23 | local_2b8 & uVar3;
      uVar18 = uVar18 & uVar23 | local_2b0 & uVar3;
      uVar26 = uVar22 & uVar23 | local_2a8 & uVar3;
      uVar23 = uVar23 & uVar20 | uVar3 & local_2a0;
      local_818 = uVar11;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar27;
      local_7d8 = uVar25;
      uStack_7d0 = uVar18;
      local_7c8 = uVar26;
      uStack_7c0 = uVar23;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,0xd);
      uVar20 = ~uVar3;
      uVar11 = uVar11 & uVar20 | local_298 & uVar3;
      uVar19 = uVar19 & uVar20 | local_290 & uVar3;
      uVar24 = uVar24 & uVar20 | local_288 & uVar3;
      uVar9 = uVar9 & uVar20 | local_280 & uVar3;
      uVar12 = uVar12 & uVar20 | local_278 & uVar3;
      uVar17 = uVar17 & uVar20 | local_270 & uVar3;
      uVar16 = uVar16 & uVar20 | local_268 & uVar3;
      uVar27 = uVar27 & uVar20 | local_260 & uVar3;
      uVar22 = uVar25 & uVar20 | local_258 & uVar3;
      uVar25 = uVar18 & uVar20 | local_250 & uVar3;
      uVar26 = uVar26 & uVar20 | local_248 & uVar3;
      uVar18 = uVar20 & uVar23 | uVar3 & local_240;
      local_818 = uVar11;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar27;
      local_7d8 = uVar22;
      uStack_7d0 = uVar25;
      local_7c8 = uVar26;
      uStack_7c0 = uVar18;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,0xe);
      uVar23 = ~uVar3;
      uVar20 = uVar11 & uVar23 | local_238 & uVar3;
      uVar19 = uVar19 & uVar23 | local_230 & uVar3;
      uVar24 = uVar24 & uVar23 | local_228 & uVar3;
      uVar9 = uVar9 & uVar23 | local_220 & uVar3;
      uVar12 = uVar12 & uVar23 | local_218 & uVar3;
      uVar17 = uVar17 & uVar23 | local_210 & uVar3;
      uVar16 = uVar16 & uVar23 | local_208 & uVar3;
      uVar27 = uVar27 & uVar23 | local_200 & uVar3;
      uVar22 = uVar22 & uVar23 | local_1f8 & uVar3;
      uVar25 = uVar25 & uVar23 | local_1f0 & uVar3;
      uVar26 = uVar26 & uVar23 | local_1e8 & uVar3;
      uVar18 = uVar23 & uVar18 | uVar3 & local_1e0;
      local_818 = uVar20;
      uStack_810 = uVar19;
      local_808 = uVar24;
      uStack_800 = uVar9;
      local_7f8 = uVar12;
      uStack_7f0 = uVar17;
      local_7e8 = uVar16;
      uStack_7e0 = uVar27;
      local_7d8 = uVar22;
      uStack_7d0 = uVar25;
      local_7c8 = uVar26;
      uStack_7c0 = uVar18;
      uVar3 = FStar_UInt64_eq_mask(local_7b8,0xf);
      uVar11 = ~uVar3;
      local_818 = uVar20 & uVar11 | local_1d8 & uVar3;
      uStack_810 = uVar19 & uVar11 | local_1d0 & uVar3;
      local_808 = uVar24 & uVar11 | local_1c8 & uVar3;
      uStack_800 = uVar9 & uVar11 | local_1c0 & uVar3;
      local_7f8 = uVar12 & uVar11 | local_1b8 & uVar3;
      uStack_7f0 = uVar17 & uVar11 | local_1b0 & uVar3;
      local_7e8 = uVar16 & uVar11 | local_1a8 & uVar3;
      uStack_7e0 = uVar27 & uVar11 | local_1a0 & uVar3;
      local_7d8 = uVar22 & uVar11 | local_198 & uVar3;
      uStack_7d0 = uVar25 & uVar11 | local_190 & uVar3;
      local_7c8 = uVar26 & uVar11 | local_188 & uVar3;
      uStack_7c0 = uVar11 & uVar18 | uVar3 & local_180;
      point_add(local_178,local_178,&local_818);
      uVar10 = local_78c - 4;
    } while (uVar10 != 0xfffffffc);
    point_store(local_780,local_178);
  }
  return _Var1 && local_788 == 0xffffffffffffffff;
}

Assistant:

bool
Hacl_Impl_P256_DH_ecp256dh_r(
  uint8_t *shared_secret,
  uint8_t *their_pubkey,
  uint8_t *private_key
)
{
  uint64_t tmp[16U] = { 0U };
  uint64_t *sk = tmp;
  uint64_t *pk = tmp + 4U;
  bool is_pk_valid = load_point_vartime(pk, their_pubkey);
  bn_from_bytes_be4(sk, private_key);
  uint64_t is_b_valid = bn_is_lt_order_and_gt_zero_mask4(sk);
  uint64_t oneq[4U] = { 0U };
  oneq[0U] = 1ULL;
  oneq[1U] = 0ULL;
  oneq[2U] = 0ULL;
  oneq[3U] = 0ULL;
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint64_t *os = sk;
    uint64_t uu____0 = oneq[i];
    uint64_t x = uu____0 ^ (is_b_valid & (sk[i] ^ uu____0));
    os[i] = x;);
  uint64_t is_sk_valid = is_b_valid;
  uint64_t ss_proj[12U] = { 0U };
  if (is_pk_valid)
  {
    point_mul(ss_proj, sk, pk);
    point_store(shared_secret, ss_proj);
  }
  return is_sk_valid == 0xFFFFFFFFFFFFFFFFULL && is_pk_valid;
}